

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::GLES2ThreadTest::DestroyImage::DestroyImage
          (DestroyImage *this,SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image,bool useSync,
          bool serverSync)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Object> local_40 [2];
  undefined1 local_1a;
  undefined1 local_19;
  bool serverSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *pSStack_18;
  bool useSync_local;
  SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *image_local;
  DestroyImage *this_local;
  
  local_1a = serverSync;
  local_19 = useSync;
  pSStack_18 = image;
  image_local = (SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage> *)this;
  Operation::Operation(&this->super_Operation,"CreateImageFromTexture",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__DestroyImage_03277a58;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>::SharedPtr(&this->m_image,image);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::SharedPtr<deqp::egl::GLES2ThreadTest::EGLImage>
            (local_40,image);
  Operation::modifyGLObject(&this->super_Operation,local_40);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Object>::~SharedPtr(local_40);
  return;
}

Assistant:

DestroyImage::DestroyImage (SharedPtr<EGLImage> image, bool useSync, bool serverSync)
	: Operation	("CreateImageFromTexture", useSync, serverSync)
	, m_image	(image)
{
	modifyGLObject(SharedPtr<Object>(image));
}